

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::ExtractSubrange
          (RepeatedField<google::protobuf::UnknownField> *this,int start,int num,
          UnknownField *elements)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  UnknownField *pUVar6;
  UnknownField *pUVar7;
  UnknownField *pUVar8;
  int local_98;
  int local_94;
  int i_1;
  int i;
  UnknownField *elem;
  Voidify local_71;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  int old_size;
  bool is_soo;
  Voidify local_49;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  UnknownField *elements_local;
  int num_local;
  int start_local;
  RepeatedField<google::protobuf::UnknownField> *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(start);
  iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20250127::log_internal::Check_GEImpl(iVar2,iVar3,"start >= 0");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x3ce,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue((int)elements_local);
  iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_48 = absl::lts_20250127::log_internal::Check_GEImpl(iVar2,iVar3,"num >= 0");
  if (local_48 == (Nullable<const_char_*>)0x0) {
    absl_log_internal_check_op_result_2._7_1_ =
         RepeatedField<google::protobuf::UnknownField>::is_soo(this);
    absl_log_internal_check_op_result_2._0_4_ =
         size(this,(bool)absl_log_internal_check_op_result_2._7_1_);
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                      (elements_local._4_4_ + (int)elements_local);
    iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue
                      ((int)absl_log_internal_check_op_result_2);
    local_70 = absl::lts_20250127::log_internal::Check_LEImpl(iVar2,iVar3,"start + num <= old_size")
    ;
    if (local_70 == (Nullable<const_char_*>)0x0) {
      pUVar6 = unsafe_elements(this,(bool)(absl_log_internal_check_op_result_2._7_1_ & 1));
      if (absl_log_internal_check_op_result != (Nullable<const_char_*>)0x0) {
        for (local_94 = 0; local_94 < (int)elements_local; local_94 = local_94 + 1) {
          *(undefined8 *)(absl_log_internal_check_op_result + (long)local_94 * 0x10) =
               *(undefined8 *)(pUVar6 + (local_94 + elements_local._4_4_));
          *(anon_union_8_5_2195ba05_for_data_ *)
           (absl_log_internal_check_op_result + (long)local_94 * 0x10 + 8) =
               pUVar6[local_94 + elements_local._4_4_].data_;
        }
      }
      if (0 < (int)elements_local) {
        for (local_98 = elements_local._4_4_ + (int)elements_local;
            local_98 < (int)absl_log_internal_check_op_result_2; local_98 = local_98 + 1) {
          pUVar8 = pUVar6 + local_98;
          pUVar7 = pUVar6 + (local_98 - (int)elements_local);
          uVar1 = pUVar8->type_;
          pUVar7->number_ = pUVar8->number_;
          pUVar7->type_ = uVar1;
          pUVar7->data_ = pUVar8->data_;
        }
        Truncate(this,(int)absl_log_internal_check_op_result_2 - (int)elements_local);
      }
      return;
    }
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&elem,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x3d2,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&elem);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&elem);
  }
  pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&old_size,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x3cf,pcVar4);
  pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&old_size);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar5);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&old_size);
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_LE(start + num, old_size);
  Element* elem = unsafe_elements(is_soo);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = std::move(elem[i + start]);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < old_size; ++i)
      elem[i - num] = std::move(elem[i]);
    Truncate(old_size - num);
  }
}